

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastDecimalToNumeric<long,short>
               (long input,short *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  byte in_CL;
  long in_RDI;
  string error;
  long scaled_value;
  int64_t rounding;
  int64_t fNegate;
  int64_t power;
  undefined7 in_stack_ffffffffffffff48;
  PhysicalType in_stack_ffffffffffffff4f;
  int64_t in_stack_ffffffffffffff50;
  string *error_message;
  string *fmt_str;
  undefined1 local_89 [33];
  string local_68 [32];
  string *local_48;
  long local_40;
  ulong local_38;
  ulong local_30;
  byte local_1;
  
  local_30 = *(ulong *)(NumericHelper::POWERS_OF_TEN + (ulong)in_CL * 8);
  local_38 = (ulong)(in_RDI < 0);
  local_40 = (long)((local_30 ^ -local_38) + local_38) / 2;
  local_48 = (string *)((in_RDI + local_40) / (long)local_30);
  UnsafeNumericCast<long,long,void>((long)local_48);
  bVar1 = TryCast::Operation<long,short>
                    (in_stack_ffffffffffffff50,
                     (int16_t *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),false)
  ;
  if (bVar1) {
    local_1 = 1;
  }
  else {
    fmt_str = (string *)local_89;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_89 + 1),"Failed to cast decimal value %d to type %s",
               (allocator *)fmt_str);
    error_message = local_48;
    GetTypeId<short>();
    StringUtil::Format<long,duckdb::PhysicalType>
              (fmt_str,(long)error_message,in_stack_ffffffffffffff4f);
    ::std::__cxx11::string::~string((string *)(local_89 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_89);
    HandleCastError::AssignError
              (error_message,
               (CastParameters *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_1 = 0;
    ::std::__cxx11::string::~string(local_68);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}